

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

int __thiscall
Rml::StringUtilities::ConvertByteOffsetToCharacterOffset
          (StringUtilities *this,StringView string,int byte_offset)

{
  bool bVar1;
  char *p_begin;
  char *p;
  char *p_end;
  ptrdiff_t pVar2;
  undefined1 local_38 [8];
  StringIteratorU8 it;
  int character_count;
  int byte_offset_local;
  StringView string_local;
  
  string_local.p_begin = string.p_begin;
  it.p._4_4_ = (int)string.p_end;
  it.p._0_4_ = 0;
  _character_count = this;
  p_begin = StringView::begin((StringView *)&character_count);
  p = StringView::begin((StringView *)&character_count);
  p_end = StringView::end((StringView *)&character_count);
  StringIteratorU8::StringIteratorU8((StringIteratorU8 *)local_38,p_begin,p,p_end);
  while ((bVar1 = StringIteratorU8::operator_cast_to_bool((StringIteratorU8 *)local_38), bVar1 &&
         (pVar2 = StringIteratorU8::offset((StringIteratorU8 *)local_38), pVar2 < it.p._4_4_))) {
    it.p._0_4_ = (int)it.p + 1;
    StringIteratorU8::operator++((StringIteratorU8 *)local_38);
  }
  return (int)it.p;
}

Assistant:

int StringUtilities::ConvertByteOffsetToCharacterOffset(StringView string, int byte_offset)
{
	int character_count = 0;
	for (auto it = StringIteratorU8(string.begin(), string.begin(), string.end()); it; ++it)
	{
		if (it.offset() >= byte_offset)
			break;
		character_count += 1;
	}
	return character_count;
}